

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O1

vorbis_info_floor * floor0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  vorbis_info_floor0 *info;
  ulong uVar8;
  
  pvVar1 = vi->codec_setup;
  __ptr = (int *)malloc(0x68);
  lVar3 = oggpack_read(opb,8);
  *__ptr = (int)lVar3;
  lVar4 = oggpack_read(opb,0x10);
  *(long *)(__ptr + 2) = lVar4;
  lVar5 = oggpack_read(opb,0x10);
  *(long *)(__ptr + 4) = lVar5;
  lVar6 = oggpack_read(opb,6);
  __ptr[6] = (int)lVar6;
  lVar6 = oggpack_read(opb,8);
  __ptr[7] = (int)lVar6;
  lVar6 = oggpack_read(opb,4);
  uVar7 = (uint)lVar6 + 1;
  __ptr[8] = uVar7;
  if ((lVar4 < 1 || (int)lVar3 < 1) || (0x7ffffffe < (uint)lVar6 || lVar5 < 1)) {
LAB_00121249:
    __ptr[0x14] = 0;
    __ptr[0x15] = 0;
    __ptr[0x16] = 0;
    __ptr[0x17] = 0;
    __ptr[0x10] = 0;
    __ptr[0x11] = 0;
    __ptr[0x12] = 0;
    __ptr[0x13] = 0;
    __ptr[0xc] = 0;
    __ptr[0xd] = 0;
    __ptr[0xe] = 0;
    __ptr[0xf] = 0;
    __ptr[8] = 0;
    __ptr[9] = 0;
    __ptr[10] = 0;
    __ptr[0xb] = 0;
    __ptr[4] = 0;
    __ptr[5] = 0;
    __ptr[6] = 0;
    __ptr[7] = 0;
    __ptr[0] = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[0x18] = 0;
    __ptr[0x19] = 0;
    free(__ptr);
    __ptr = (int *)0x0;
  }
  else {
    uVar8 = 0;
    do {
      lVar3 = oggpack_read(opb,8);
      iVar2 = (int)lVar3;
      __ptr[uVar8 + 9] = iVar2;
      if ((iVar2 < 0) || (*(int *)((long)pvVar1 + 0x24) <= iVar2)) goto LAB_00121249;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return __ptr;
}

Assistant:

static vorbis_info_floor *floor0_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j;

  vorbis_info_floor0 *info=(vorbis_info_floor0 *)_ogg_malloc(sizeof(*info));
  info->order=oggpack_read(opb,8);
  info->rate=oggpack_read(opb,16);
  info->barkmap=oggpack_read(opb,16);
  info->ampbits=oggpack_read(opb,6);
  info->ampdB=oggpack_read(opb,8);
  info->numbooks=oggpack_read(opb,4)+1;
  
  if(info->order<1)goto err_out;
  if(info->rate<1)goto err_out;
  if(info->barkmap<1)goto err_out;
  if(info->numbooks<1)goto err_out;
    
  for(j=0;j<info->numbooks;j++){
    info->books[j]=oggpack_read(opb,8);
    if(info->books[j]<0 || info->books[j]>=ci->books)goto err_out;
  }
  return(info);

 err_out:
  floor0_free_info(info);
  return(NULL);
}